

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

uint32_t helper_sve_predtest_aarch64(void *vd,void *vg,uint32_t words)

{
  uint32_t flags;
  ulong uVar1;
  
  flags = 1;
  uVar1 = 0;
  do {
    flags = iter_predtest_fwd(*(uint64_t *)((long)vd + uVar1 * 8),
                              *(uint64_t *)((long)vg + uVar1 * 8),flags);
    uVar1 = uVar1 + 1;
  } while (words + (words == 0) != uVar1);
  return flags;
}

Assistant:

uint32_t HELPER(sve_predtest)(void *vd, void *vg, uint32_t words)
{
    uint32_t flags = PREDTEST_INIT;
    uint64_t *d = vd, *g = vg;
    uintptr_t i = 0;

    do {
        flags = iter_predtest_fwd(d[i], g[i], flags);
    } while (++i < words);

    return flags;
}